

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Vec_Int_t *p_00;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pObj;
  int *piVar11;
  Hash_IntMan_t *pHVar12;
  Vec_Flt_t *pVVar13;
  float *pfVar14;
  Vec_Que_t *pVVar15;
  Vec_Int_t *pVVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  double dVar23;
  int local_70;
  int local_6c;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  
  Dam_ManCollectSets(p);
  pVVar16 = p->pGia->vSuper;
  p_00 = Vec_IntAlloc(p->pGia->nObjs);
  p_01 = Hash_IntManStart(p->pGia->nObjs / 2);
  p_02 = Vec_IntStart(1000);
  Dam_ManCreateMultiRefs(p,&vRefsAnd,&vRefsXor);
  iVar19 = 0;
  uVar18 = 0;
  local_70 = 0;
  iVar7 = 0;
  local_6c = 0;
  while ((iVar19 < p->pGia->nObjs && (pObj = Gia_ManObj(p->pGia,iVar19), pObj != (Gia_Obj_t *)0x0)))
  {
    if (((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) &&
       (iVar1 = Dam_ObjHand(p,iVar19), iVar1 != 0)) {
      piVar11 = Dam_ObjSet(p,iVar19);
      iVar1 = *piVar11;
      pVVar16->nSize = 0;
      iVar2 = Gia_ObjIsXor(pObj);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsAndReal(p->pGia,pObj);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x270,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        for (lVar22 = 1; lVar22 <= *piVar11; lVar22 = lVar22 + 1) {
          iVar2 = Vec_IntEntry(vRefsAnd,piVar11[lVar22]);
          if (1 < iVar2) {
            Vec_IntPush(pVVar16,piVar11[lVar22]);
          }
        }
      }
      else {
        for (lVar22 = 1; lVar22 <= *piVar11; lVar22 = lVar22 + 1) {
          iVar2 = Abc_Lit2Var(piVar11[lVar22]);
          iVar2 = Vec_IntEntry(vRefsXor,iVar2);
          if (1 < iVar2) {
            Vec_IntPush(pVVar16,piVar11[lVar22]);
          }
        }
      }
      uVar18 = ((iVar1 + -1) * iVar1) / 2 + uVar18;
      iVar1 = pVVar16->nSize;
      if (1 < iVar1) {
        uVar17 = (uint)((iVar1 + -1) * iVar1) >> 1;
        uVar21 = (ulong)uVar17;
        Vec_IntPush(p_00,-iVar19);
        iVar1 = pVVar16->nSize;
        iVar2 = 0;
        while (iVar2 < iVar1) {
          iVar3 = Vec_IntEntry(pVVar16,iVar2);
          iVar2 = iVar2 + 1;
          for (iVar20 = iVar2; iVar1 = pVVar16->nSize, iVar20 < iVar1; iVar20 = iVar20 + 1) {
            iVar4 = Vec_IntEntry(pVVar16,iVar20);
            uVar5 = Gia_ObjIsXor(pObj);
            iVar1 = iVar4;
            iVar6 = iVar3;
            if (uVar5 == iVar4 < iVar3) {
              iVar1 = iVar3;
              iVar6 = iVar4;
            }
            iVar1 = Hash_Int2ManInsert(p_01,iVar1,iVar6,(int)uVar21);
            iVar6 = Hash_Int2ObjInc(p_01,iVar1);
            if (iVar6 == 1) {
              iVar7 = iVar7 + 1;
              iVar6 = Gia_ObjIsXor(pObj);
              local_6c = local_6c + iVar6;
            }
            Vec_IntPush(p_00,iVar1);
            if (p_02->nSize <= iVar1) {
              uVar21 = 2;
              Vec_IntFillExtra(p_02,(p_02->nSize * 3) / 2,0);
            }
            iVar6 = Vec_IntEntry(p->vNodLevR,iVar19);
            Vec_IntUpdateEntry(p_02,iVar1,iVar6);
          }
        }
        local_70 = local_70 + uVar17;
      }
    }
    iVar19 = iVar19 + 1;
  }
  Vec_IntFree(vRefsAnd);
  Vec_IntFree(vRefsXor);
  pHVar12 = Hash_IntManStart((iVar7 * 3) / 2);
  p->vHash = pHVar12;
  iVar19 = iVar7 * 2;
  pVVar13 = (Vec_Flt_t *)malloc(0x10);
  iVar1 = iVar19;
  if (iVar7 * 2 - 1U < 0xf) {
    iVar1 = 0x10;
  }
  pVVar13->nSize = 0;
  pVVar13->nCap = iVar1;
  iVar2 = 0;
  if (iVar1 == 0) {
    pfVar14 = (float *)0x0;
  }
  else {
    pfVar14 = (float *)malloc((long)iVar1 << 2);
  }
  pVVar13->pArray = pfVar14;
  p->vCounts = pVVar13;
  Vec_FltPush(pVVar13,1e+09);
  pVVar13 = p->vCounts;
  uVar17 = pVVar13->nCap;
  pVVar15 = (Vec_Que_t *)calloc(1,0x20);
  uVar21 = 0x10;
  if (0x10 < (int)uVar17) {
    uVar21 = (ulong)uVar17;
  }
  pVVar15->nSize = 1;
  pVVar15->nCap = (int)uVar21 + 1;
  __size = uVar21 * 4 + 4;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  pVVar15->pHeap = piVar11;
  piVar11 = (int *)malloc(__size);
  memset(piVar11,0xff,__size);
  pVVar15->pOrder = piVar11;
  p->vQue = pVVar15;
  pVVar15->pCostsFlt = &pVVar13->pArray;
  pVVar16 = Vec_IntAlloc(iVar19);
  p->vDiv2Nod = pVVar16;
  Vec_IntPush(pVVar16,1000000000);
  pVVar16 = Vec_IntAlloc(p->pGia->nObjs);
  p->vNodStore = pVVar16;
  Vec_IntPush(pVVar16,-1);
  uVar21 = 4;
  iVar20 = p_01->vObjs->nSize / 4;
  uVar17 = iVar20 - 1;
  pVVar16 = Vec_IntAlloc(iVar20);
  pVVar16->nSize = iVar20;
  memset(pVVar16->pArray,0xff,(long)iVar20 << 2);
  iVar1 = 1;
  uVar5 = 0;
  do {
    if (iVar20 <= iVar1) {
      if (p->vCounts->nSize != p->vHash->vObjs->nSize / 4) {
        __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2ab,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      if (p->vDiv2Nod->nSize != iVar7 + 1) {
        __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2ac,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      Hash_IntManStop(p_01);
      Vec_IntFree(p_02);
      iVar1 = p_00->nSize;
      iVar20 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      iVar3 = -1;
      for (; iVar1 != iVar20; iVar20 = iVar20 + 1) {
        iVar6 = Vec_IntEntry(p_00,iVar20);
        if (iVar6 < 0) {
          iVar3 = -iVar6;
        }
        else {
          iVar6 = Vec_IntEntry(pVVar16,iVar6);
          if (iVar6 != -1) {
            piVar11 = Dam_DivSet(p,iVar6);
            iVar6 = *piVar11;
            *piVar11 = iVar6 + 1;
            piVar11[(long)iVar6 + 1] = iVar3;
          }
        }
      }
      Vec_IntFree(pVVar16);
      Vec_IntFree(p_00);
      pVVar16 = Vec_IntStart(iVar19);
      p->vDivLevR = pVVar16;
      if (fVerbose == 0) {
        return;
      }
      printf("Pairs:");
      uVar10 = 1;
      if (1 < (int)uVar18) {
        uVar10 = uVar18;
      }
      dVar23 = (double)(int)uVar10;
      printf("  Total =%9d (%6.2f %%)",((double)(int)uVar18 * 100.0) / dVar23);
      printf("  Tried =%9d (%6.2f %%)",((double)local_70 * 100.0) / dVar23);
      printf("  Used =%9d (%6.2f %%)",((double)iVar2 * 100.0) / dVar23);
      printf("  Xor =%9d (%6.2f %%)",((double)(int)uVar5 * 100.0) / dVar23,(ulong)uVar5);
      putchar(10);
      printf("Div:  ");
      uVar18 = 1;
      if (1 < (int)uVar17) {
        uVar18 = uVar17;
      }
      dVar23 = (double)(int)uVar18;
      printf("  Total =%9d (%6.2f %%)",(ulong)uVar17);
      printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar17 * 100.0) / dVar23,(ulong)uVar17);
      printf("  Used =%9d (%6.2f %%)",((double)iVar7 * 100.0) / dVar23);
      printf("  Xor =%9d (%6.2f %%)",((double)local_6c * 100.0) / dVar23);
      putchar(10);
      return;
    }
    iVar3 = Hash_IntObjData2(p_01,iVar1);
    iVar6 = (int)uVar21;
    if (1 < iVar3) {
      iVar8 = Hash_IntObjData0(p_01,iVar1);
      iVar9 = Hash_IntObjData1(p_01,iVar1);
      iVar4 = 0;
      if (iVar9 < iVar8) {
        iVar4 = iVar3;
      }
      pHVar12 = p->vHash;
      iVar8 = Hash_IntObjData0(p_01,iVar1);
      iVar9 = Hash_IntObjData1(p_01,iVar1);
      iVar6 = Hash_Int2ManInsert(pHVar12,iVar8,iVar9,iVar6);
      if (iVar6 != p->vHash->vObjs->nSize / 4 + -1) {
        __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x29f,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      pVVar13 = p->vCounts;
      if (iVar6 != pVVar13->nSize) {
        __assert_fail("Num == Vec_FltSize(p->vCounts)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2a0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      iVar8 = Hash_IntObjData0(p_01,iVar1);
      iVar9 = Hash_IntObjData1(p_01,iVar1);
      uVar10 = Vec_IntEntry(p_02,iVar1);
      uVar21 = (ulong)uVar10;
      iVar8 = Dam_ManDivSlack(p,iVar8,iVar9,uVar10);
      Vec_FltPush(pVVar13,(float)iVar8 * 0.005 + (float)iVar3);
      Vec_QuePush(p->vQue,iVar6);
      if (iVar6 != p->vDiv2Nod->nSize) {
        __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2a4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      iVar2 = iVar2 + iVar3;
      uVar5 = uVar5 + iVar4;
      Vec_IntPush(p->vDiv2Nod,p->vNodStore->nSize);
      Vec_IntPush(p->vNodStore,0);
      Vec_IntFillExtra(p->vNodStore,p->vNodStore->nSize + iVar3,-1);
      Vec_IntWriteEntry(pVVar16,iVar1,iVar6);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}